

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

visplane_t * swrenderer::R_CheckPlane(visplane_t *pl,int start,int stop)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  visplane_t *pvVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  short *psVar12;
  
  if ((start < 0) || (viewwidth <= start)) {
    __assert_fail("start >= 0 && start < viewwidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_plane.cpp"
                  ,0x200,"visplane_t *swrenderer::R_CheckPlane(visplane_t *, int, int)");
  }
  if ((start < stop) && (stop <= viewwidth)) {
    uVar11 = pl->left;
    iVar8 = pl->right;
    uVar2 = start;
    if (start < (int)uVar11) {
      uVar2 = uVar11;
    }
    uVar9 = (ulong)uVar2;
    if (start <= (int)uVar11) {
      uVar11 = start;
    }
    iVar3 = stop;
    if (iVar8 < stop) {
      iVar3 = iVar8;
    }
    if (iVar8 <= stop) {
      iVar8 = stop;
    }
    psVar12 = (short *)(&pl->field_0xda + uVar9 * 2);
    do {
      if (iVar3 <= (int)uVar9) {
        pl->left = uVar11;
        pl->right = iVar8;
        return pl;
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      sVar1 = *psVar12;
      psVar12 = psVar12 + 1;
    } while (sVar1 == 0x7fff);
    if (((pl->portal == (FSectorPortal *)0x0) || ((pl->portal->mFlags & 2) != 0)) ||
       (uVar11 = 0x80, !viewactive)) {
      uVar11 = SUB84((pl->height).D + 103079215104.0,0) * 7 +
               (pl->picnum).texnum * 3 + pl->lightlevel & 0x7f;
    }
    pvVar7 = new_visplane(uVar11);
    (pvVar7->height).normal.Z = (pl->height).normal.Z;
    dVar4 = (pl->height).normal.Y;
    (pvVar7->height).normal.X = (pl->height).normal.X;
    (pvVar7->height).normal.Y = dVar4;
    dVar4 = (pl->height).negiC;
    (pvVar7->height).D = (pl->height).D;
    (pvVar7->height).negiC = dVar4;
    (pvVar7->picnum).texnum = (pl->picnum).texnum;
    pvVar7->lightlevel = pl->lightlevel;
    (pvVar7->xform).yScale = (pl->xform).yScale;
    dVar4 = (pl->xform).xOffs;
    dVar5 = (pl->xform).yOffs;
    dVar6 = (pl->xform).xScale;
    (pvVar7->xform).baseyOffs = (pl->xform).baseyOffs;
    (pvVar7->xform).xScale = dVar6;
    (pvVar7->xform).xOffs = dVar4;
    (pvVar7->xform).yOffs = dVar5;
    (pvVar7->xform).Angle.Degrees = (pl->xform).Angle.Degrees;
    (pvVar7->xform).baseAngle.Degrees = (pl->xform).baseAngle.Degrees;
    pvVar7->colormap = pl->colormap;
    pvVar7->portal = pl->portal;
    pvVar7->extralight = pl->extralight;
    pvVar7->visibility = pl->visibility;
    (pvVar7->viewpos).Z = (pl->viewpos).Z;
    dVar4 = (pl->viewpos).Y;
    (pvVar7->viewpos).X = (pl->viewpos).X;
    (pvVar7->viewpos).Y = dVar4;
    (pvVar7->viewangle).Degrees = (pl->viewangle).Degrees;
    pvVar7->sky = pl->sky;
    pvVar7->Alpha = pl->Alpha;
    pvVar7->Additive = pl->Additive;
    pvVar7->CurrentPortalUniq = pl->CurrentPortalUniq;
    pvVar7->MirrorFlags = pl->MirrorFlags;
    pvVar7->CurrentSkybox = pl->CurrentSkybox;
    pvVar7->left = start;
    pvVar7->right = stop;
    uVar9 = (ulong)(uint)viewwidth;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      *(undefined2 *)(&pvVar7->field_0xda + uVar10 * 2) = 0x7fff;
    }
    return pvVar7;
  }
  __assert_fail("stop > start && stop <= viewwidth",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_plane.cpp"
                ,0x201,"visplane_t *swrenderer::R_CheckPlane(visplane_t *, int, int)");
}

Assistant:

visplane_t *R_CheckPlane (visplane_t *pl, int start, int stop)
{
	int intrl, intrh;
	int unionl, unionh;
	int x;

	assert (start >= 0 && start < viewwidth);
	assert (stop > start && stop <= viewwidth);

	if (start < pl->left)
	{
		intrl = pl->left;
		unionl = start;
	}
	else
	{
		unionl = pl->left;
		intrl = start;
	}
		
	if (stop > pl->right)
	{
		intrh = pl->right;
		unionh = stop;
	}
	else
	{
		unionh = pl->right;
		intrh = stop;
	}

	for (x = intrl; x < intrh && pl->top[x] == 0x7fff; x++)
		;

	if (x >= intrh)
	{
		// use the same visplane
		pl->left = unionl;
		pl->right = unionh;
	}
	else
	{
		// make a new visplane
		unsigned hash;

		if (pl->portal != NULL && !(pl->portal->mFlags & PORTSF_INSKYBOX) && viewactive)
		{
			hash = MAXVISPLANES;
		}
		else
		{
			hash = visplane_hash (pl->picnum.GetIndex(), pl->lightlevel, pl->height);
		}
		visplane_t *new_pl = new_visplane (hash);

		new_pl->height = pl->height;
		new_pl->picnum = pl->picnum;
		new_pl->lightlevel = pl->lightlevel;
		new_pl->xform = pl->xform;
		new_pl->colormap = pl->colormap;
		new_pl->portal = pl->portal;
		new_pl->extralight = pl->extralight;
		new_pl->visibility = pl->visibility;
		new_pl->viewpos = pl->viewpos;
		new_pl->viewangle = pl->viewangle;
		new_pl->sky = pl->sky;
		new_pl->Alpha = pl->Alpha;
		new_pl->Additive = pl->Additive;
		new_pl->CurrentPortalUniq = pl->CurrentPortalUniq;
		new_pl->MirrorFlags = pl->MirrorFlags;
		new_pl->CurrentSkybox = pl->CurrentSkybox;
		pl = new_pl;
		pl->left = start;
		pl->right = stop;
		fillshort (pl->top, viewwidth, 0x7fff);
	}
	return pl;
}